

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_default_vfs_init(ma_default_vfs *pVFS,ma_allocation_callbacks *pAllocationCallbacks)

{
  if (pVFS != (ma_default_vfs *)0x0) {
    (pVFS->cb).onOpen = ma_default_vfs_open;
    (pVFS->cb).onOpenW = ma_default_vfs_open_w;
    (pVFS->cb).onClose = ma_default_vfs_close;
    (pVFS->cb).onRead = ma_default_vfs_read;
    (pVFS->cb).onWrite = ma_default_vfs_write;
    (pVFS->cb).onSeek = ma_default_vfs_seek;
    (pVFS->cb).onTell = ma_default_vfs_tell;
    (pVFS->cb).onInfo = ma_default_vfs_info;
    ma_allocation_callbacks_init_copy(&pVFS->allocationCallbacks,pAllocationCallbacks);
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_default_vfs_init(ma_default_vfs* pVFS, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pVFS == NULL) {
        return MA_INVALID_ARGS;
    }

    pVFS->cb.onOpen  = ma_default_vfs_open;
    pVFS->cb.onOpenW = ma_default_vfs_open_w;
    pVFS->cb.onClose = ma_default_vfs_close;
    pVFS->cb.onRead  = ma_default_vfs_read;
    pVFS->cb.onWrite = ma_default_vfs_write;
    pVFS->cb.onSeek  = ma_default_vfs_seek;
    pVFS->cb.onTell  = ma_default_vfs_tell;
    pVFS->cb.onInfo  = ma_default_vfs_info;
    ma_allocation_callbacks_init_copy(&pVFS->allocationCallbacks, pAllocationCallbacks);

    return MA_SUCCESS;
}